

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# music_fluidsynth_mididevice.cpp
# Opt level: O2

void __thiscall FluidSynthMIDIDevice::FluidSynthMIDIDevice(FluidSynthMIDIDevice *this,char *args)

{
  fluid_settings_t **ppfVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  _func_fluid_settings_t_ptr *p_Var5;
  fluid_settings_t *pfVar6;
  _func_int_fluid_settings_t_ptr_char_ptr_double *p_Var7;
  _func_int_fluid_settings_t_ptr_char_ptr_int *p_Var8;
  _func_fluid_synth_t_ptr_fluid_settings_t_ptr *p_Var9;
  fluid_synth_t *pfVar10;
  _func_int_fluid_synth_t_ptr_int_int *p_Var11;
  _func_void_fluid_synth_t_ptr_double_double_double_double *p_Var12;
  _func_void_fluid_synth_t_ptr_int_double_double_double_int *p_Var13;
  _func_int_fluid_synth_t_ptr *p_Var14;
  FluidSynthMIDIDevice *this_00;
  float extraout_XMM0_Da;
  
  this_00 = this;
  SoftSynthMIDIDevice::SoftSynthMIDIDevice(&this->super_SoftSynthMIDIDevice);
  (this->super_SoftSynthMIDIDevice).super_MIDIDevice._vptr_MIDIDevice =
       (_func_int **)&PTR__FluidSynthMIDIDevice_006eaf60;
  this->FluidSettings = (fluid_settings_t *)0x0;
  this->FluidSynth = (fluid_synth_t *)0x0;
  bVar2 = LoadFluidSynth(this_00);
  if (bVar2) {
    p_Var5 = TReqProc::operator_cast_to_function_pointer((TReqProc *)&new_fluid_settings);
    pfVar6 = (*p_Var5)();
    ppfVar1 = &this->FluidSettings;
    *ppfVar1 = pfVar6;
    iVar4 = fluid_samplerate.Value;
    if (pfVar6 == (fluid_settings_t *)0x0) {
      puts("Failed to create FluidSettings.");
      return;
    }
    (this->super_SoftSynthMIDIDevice).SampleRate = fluid_samplerate.Value;
    if (iVar4 - 0x17701U < 0xfffedf21) {
      (*GSnd->_vptr_SoundRenderer[10])();
      iVar4 = 96000;
      if ((int)extraout_XMM0_Da < 96000) {
        iVar4 = (int)extraout_XMM0_Da;
      }
      iVar3 = 0x5622;
      if (0x5622 < iVar4) {
        iVar3 = iVar4;
      }
      (this->super_SoftSynthMIDIDevice).SampleRate = iVar3;
    }
    p_Var7 = TReqProc::operator_cast_to_function_pointer((TReqProc *)&fluid_settings_setnum);
    (*p_Var7)(this->FluidSettings,"synth.sample-rate",
              (double)(this->super_SoftSynthMIDIDevice).SampleRate);
    p_Var7 = TReqProc::operator_cast_to_function_pointer((TReqProc *)&fluid_settings_setnum);
    (*p_Var7)(*ppfVar1,"synth.gain",(double)fluid_gain.Value);
    p_Var8 = TReqProc::operator_cast_to_function_pointer((TReqProc *)&fluid_settings_setint);
    (*p_Var8)(*ppfVar1,"synth.reverb.active",(uint)fluid_reverb.Value);
    p_Var8 = TReqProc::operator_cast_to_function_pointer((TReqProc *)&fluid_settings_setint);
    (*p_Var8)(*ppfVar1,"synth.chorus.active",(uint)fluid_chorus.Value);
    p_Var8 = TReqProc::operator_cast_to_function_pointer((TReqProc *)&fluid_settings_setint);
    (*p_Var8)(*ppfVar1,"synth.polyphony",fluid_voices.Value);
    p_Var8 = TReqProc::operator_cast_to_function_pointer((TReqProc *)&fluid_settings_setint);
    (*p_Var8)(*ppfVar1,"synth.cpu-cores",fluid_threads.Value);
    p_Var9 = TReqProc::operator_cast_to_function_pointer((TReqProc *)&new_fluid_synth);
    pfVar10 = (*p_Var9)(*ppfVar1);
    this->FluidSynth = pfVar10;
    if (pfVar10 == (fluid_synth_t *)0x0) {
      Printf("Failed to create FluidSynth.\n");
    }
    else {
      p_Var11 = TReqProc::operator_cast_to_function_pointer
                          ((TReqProc *)&fluid_synth_set_interp_method);
      (*p_Var11)(this->FluidSynth,-1,fluid_interp.Value);
      p_Var12 = TReqProc::operator_cast_to_function_pointer((TReqProc *)&fluid_synth_set_reverb);
      (*p_Var12)(this->FluidSynth,(double)fluid_reverb_roomsize.Value,
                 (double)fluid_reverb_damping.Value,(double)fluid_reverb_width.Value,
                 (double)fluid_reverb_level.Value);
      p_Var13 = TReqProc::operator_cast_to_function_pointer((TReqProc *)&fluid_synth_set_chorus);
      (*p_Var13)(this->FluidSynth,fluid_chorus_voices.Value,(double)fluid_chorus_level.Value,
                 (double)fluid_chorus_speed.Value,(double)fluid_chorus_depth.Value,
                 fluid_chorus_type.Value);
      if (((args != (char *)0x0) && (*args != '\0')) &&
         (iVar4 = LoadPatchSets(this,args), iVar4 != 0)) {
        return;
      }
      iVar4 = LoadPatchSets(this,fluid_patchset.Value);
      if ((iVar4 == 0) &&
         (iVar4 = LoadPatchSets(this,
                                "/usr/share/sounds/sf2/FluidR3_GS.sf2:/usr/share/sounds/sf2/FluidR3_GM.sf2"
                               ), iVar4 == 0)) {
        Printf("Failed to load any MIDI patches.\n");
        p_Var14 = TReqProc::operator_cast_to_function_pointer((TReqProc *)&delete_fluid_synth);
        (*p_Var14)(this->FluidSynth);
        this->FluidSynth = (fluid_synth_t *)0x0;
      }
    }
  }
  return;
}

Assistant:

FluidSynthMIDIDevice::FluidSynthMIDIDevice(const char *args)
{
	FluidSynth = NULL;
	FluidSettings = NULL;
#ifdef DYN_FLUIDSYNTH
	if (!LoadFluidSynth())
	{
		return;
	}
#endif
	FluidSettings = new_fluid_settings();
	if (FluidSettings == NULL)
	{
		printf("Failed to create FluidSettings.\n");
		return;
	}
	SampleRate = fluid_samplerate;
	if (SampleRate < 22050 || SampleRate > 96000)
	{ // Match sample rate to SFX rate
		SampleRate = clamp((int)GSnd->GetOutputRate(), 22050, 96000);
	}
	fluid_settings_setnum(FluidSettings, "synth.sample-rate", SampleRate);
	fluid_settings_setnum(FluidSettings, "synth.gain", fluid_gain);
	fluid_settings_setint(FluidSettings, "synth.reverb.active", fluid_reverb);
	fluid_settings_setint(FluidSettings, "synth.chorus.active", fluid_chorus);
	fluid_settings_setint(FluidSettings, "synth.polyphony", fluid_voices);
	fluid_settings_setint(FluidSettings, "synth.cpu-cores", fluid_threads);
	FluidSynth = new_fluid_synth(FluidSettings);
	if (FluidSynth == NULL)
	{
		Printf("Failed to create FluidSynth.\n");
		return;
	}
	fluid_synth_set_interp_method(FluidSynth, -1, fluid_interp);
	fluid_synth_set_reverb(FluidSynth, fluid_reverb_roomsize, fluid_reverb_damping,
		fluid_reverb_width, fluid_reverb_level);
	fluid_synth_set_chorus(FluidSynth, fluid_chorus_voices, fluid_chorus_level,
		fluid_chorus_speed, fluid_chorus_depth, fluid_chorus_type);

	// try loading a patch set that got specified with $mididevice.
	int res = 0;
	if (args != NULL && *args != 0)
	{
		res = LoadPatchSets(args);
	}

	if (res == 0 && 0 == LoadPatchSets(fluid_patchset))
	{
#ifdef __unix__
		// This is the standard location on Ubuntu.
		if (0 == LoadPatchSets("/usr/share/sounds/sf2/FluidR3_GS.sf2:/usr/share/sounds/sf2/FluidR3_GM.sf2"))
		{
#endif
#ifdef _WIN32
		// On Windows, look for the 4 megabyte patch set installed by Creative's drivers as a default.
		char sysdir[MAX_PATH+sizeof("\\CT4MGM.SF2")];
		UINT filepart;
		if (0 != (filepart = GetSystemDirectoryA(sysdir, MAX_PATH)))
		{
			strcat(sysdir, "\\CT4MGM.SF2");
			if (0 == LoadPatchSets(sysdir))
			{
				// Try again with CT2MGM.SF2
				sysdir[filepart + 3] = '2';
				if (0 == LoadPatchSets(sysdir))
				{
#endif
					Printf("Failed to load any MIDI patches.\n");
					delete_fluid_synth(FluidSynth);
					FluidSynth = NULL;
#ifdef _WIN32
				}
			}
		}
#endif
#ifdef __unix__
		}
#endif
	}
}